

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestsetString_TrailerStructureInvalid_MessageStructureInvalid::
TestsetString_TrailerStructureInvalid_MessageStructureInvalid
          (TestsetString_TrailerStructureInvalid_MessageStructureInvalid *this)

{
  char *suiteName;
  TestsetString_TrailerStructureInvalid_MessageStructureInvalid *this_local;
  
  suiteName = SuiteMessageTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"setString_TrailerStructureInvalid_MessageStructureInvalid",suiteName
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x56c);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestsetString_TrailerStructureInvalid_MessageStructureInvalid_00459630;
  return;
}

Assistant:

TEST(setString_TrailerStructureInvalid_MessageStructureInvalid) {

  DataDictionary dictionary;
  dictionary.checkFieldsOutOfOrder(true);
  dictionary.addHeaderField(FIELD::BeginString, true);
  dictionary.addHeaderField(FIELD::MsgType, true);
  dictionary.addField(FIELD::ClOrdID);
  dictionary.addField(FIELD::MsgType);
  dictionary.addTrailerField(FIELD::CheckSum, true);
  dictionary.addFieldType(FIELD::CheckSum, FIX::TYPE::Type::Int);

  dictionary.setVersion(BeginString_FIX42);

  FIX::Message msg;
  std::string delimSOH = "\x01";
  std::string rawFixMsg = "8=FIX.4.2" + delimSOH
      + "9=200"         + delimSOH
      + "35=A"          + delimSOH
      + "49=SENDER"     + delimSOH
      + "56=TARGET"     + delimSOH
      + "34=1"          + delimSOH
      + "98=0"          + delimSOH
      + "10=200"        + delimSOH //Trailer in Body is invalid
      + "108=30"        + delimSOH
      + "10=200"        + delimSOH;


  msg.setString(rawFixMsg, false, &dictionary, &dictionary);
  int checkSumTag = FIELD::CheckSum;
  CHECK(!msg.hasValidStructure(checkSumTag));
}